

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool ecdsa_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  ecsign_extra *extra_00;
  _Bool _Var1;
  uint uVar2;
  ssh_key *psVar3;
  mp_int *local_f0;
  mp_int *x;
  WeierstrassPoint *sum;
  WeierstrassPoint *u2P;
  WeierstrassPoint *u1G;
  mp_int *u2;
  mp_int *u1;
  mp_int *w;
  mp_int *z;
  mp_int *pmStack_a8;
  uint invalid;
  mp_int *s;
  mp_int *r;
  ptrlen sigstr;
  undefined1 local_78 [8];
  BinarySource src [1];
  ecsign_extra *extra;
  ecdsa_key *ek;
  ssh_key *key_local;
  ptrlen data_local;
  ptrlen sig_local;
  
  psVar3 = key + -3;
  extra_00 = (ecsign_extra *)key->vt->extra;
  BinarySource_INIT__((BinarySource *)local_78,sig);
  join_0x00000010_0x00000000_ = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  _Var1 = ptrlen_eq_string(join_0x00000010_0x00000000_,key->vt->ssh_id);
  if (_Var1) {
    _r = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
      BinarySource_INIT__((BinarySource *)local_78,_r);
      s = BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
      pmStack_a8 = BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
      if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
        z._4_4_ = 0;
        uVar2 = mp_eq_integer(s,0);
        z._4_4_ = uVar2 | z._4_4_;
        uVar2 = mp_eq_integer(pmStack_a8,0);
        z._4_4_ = uVar2 | z._4_4_;
        uVar2 = mp_cmp_hs(s,(mp_int *)psVar3->vt->private_blob);
        z._4_4_ = uVar2 | z._4_4_;
        uVar2 = mp_cmp_hs(pmStack_a8,(mp_int *)psVar3->vt->private_blob);
        z._4_4_ = uVar2 | z._4_4_;
        w = ecdsa_signing_exponent_from_data((ec_curve *)psVar3->vt,extra_00,data);
        u1 = mp_invert(pmStack_a8,(mp_int *)psVar3->vt->private_blob);
        u2 = mp_modmul(w,u1,(mp_int *)psVar3->vt->private_blob);
        mp_free(w);
        u1G = (WeierstrassPoint *)mp_modmul(s,u1,(mp_int *)psVar3->vt->private_blob);
        mp_free(u1);
        u2P = ecc_weierstrass_multiply((WeierstrassPoint *)psVar3->vt->public_blob,u2);
        mp_free(u2);
        sum = ecc_weierstrass_multiply((WeierstrassPoint *)key[-2].vt,(mp_int *)u1G);
        mp_free((mp_int *)u1G);
        x = (mp_int *)ecc_weierstrass_add_general(u2P,sum);
        ecc_weierstrass_point_free(u2P);
        ecc_weierstrass_point_free(sum);
        ecc_weierstrass_get_affine((WeierstrassPoint *)x,&local_f0,(mp_int **)0x0);
        ecc_weierstrass_point_free((WeierstrassPoint *)x);
        mp_divmod_into(local_f0,(mp_int *)psVar3->vt->private_blob,(mp_int *)0x0,local_f0);
        uVar2 = mp_cmp_eq(s,local_f0);
        z._4_4_ = uVar2 ^ 1 | z._4_4_;
        mp_free(local_f0);
        mp_free(s);
        mp_free(pmStack_a8);
        sig_local.len._7_1_ = z._4_4_ == 0;
      }
      else {
        mp_free(s);
        mp_free(pmStack_a8);
        sig_local.len._7_1_ = false;
      }
    }
    else {
      sig_local.len._7_1_ = false;
    }
  }
  else {
    sig_local.len._7_1_ = false;
  }
  return sig_local.len._7_1_;
}

Assistant:

static bool ecdsa_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, sig);

    /* Check the signature starts with the algorithm name */
    if (!ptrlen_eq_string(get_string(src), ek->sshk.vt->ssh_id))
        return false;

    /* Everything else is nested inside a sub-string. Descend into that. */
    ptrlen sigstr = get_string(src);
    if (get_err(src))
        return false;
    BinarySource_BARE_INIT_PL(src, sigstr);

    /* Extract the signature integers r,s */
    mp_int *r = get_mp_ssh2(src);
    mp_int *s = get_mp_ssh2(src);
    if (get_err(src)) {
        mp_free(r);
        mp_free(s);
        return false;
    }

    /* Basic sanity checks: 0 < r,s < order(G) */
    unsigned invalid = 0;
    invalid |= mp_eq_integer(r, 0);
    invalid |= mp_eq_integer(s, 0);
    invalid |= mp_cmp_hs(r, ek->curve->w.G_order);
    invalid |= mp_cmp_hs(s, ek->curve->w.G_order);

    /* Get the hash of the signed data, converted to an integer */
    mp_int *z = ecdsa_signing_exponent_from_data(ek->curve, extra, data);

    /* Verify the signature integers against the hash */
    mp_int *w = mp_invert(s, ek->curve->w.G_order);
    mp_int *u1 = mp_modmul(z, w, ek->curve->w.G_order);
    mp_free(z);
    mp_int *u2 = mp_modmul(r, w, ek->curve->w.G_order);
    mp_free(w);
    WeierstrassPoint *u1G = ecc_weierstrass_multiply(ek->curve->w.G, u1);
    mp_free(u1);
    WeierstrassPoint *u2P = ecc_weierstrass_multiply(ek->publicKey, u2);
    mp_free(u2);
    WeierstrassPoint *sum = ecc_weierstrass_add_general(u1G, u2P);
    ecc_weierstrass_point_free(u1G);
    ecc_weierstrass_point_free(u2P);

    mp_int *x;
    ecc_weierstrass_get_affine(sum, &x, NULL);
    ecc_weierstrass_point_free(sum);

    mp_divmod_into(x, ek->curve->w.G_order, NULL, x);
    invalid |= (1 ^ mp_cmp_eq(r, x));
    mp_free(x);

    mp_free(r);
    mp_free(s);

    return !invalid;
}